

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O2

bool __thiscall
HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::erase
          (HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
           *this,KeyType *key)

{
  byte bVar1;
  _Head_base<0UL,_HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>_*,_false>
  _Var2;
  uchar *puVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  u8 meta;
  u64 pos;
  u64 maxPos;
  u64 startPos;
  u8 local_29;
  ulong local_28;
  u64 local_20;
  u64 local_18;
  
  bVar4 = findPosition(this,key,&local_29,&local_18,&local_20,&local_28);
  if (bVar4) {
    _Var2._M_head_impl =
         (this->entries)._M_t.
         super___uniq_ptr_impl<HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>,_HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::OpNewDeleter>
         ._M_t.
         super__Tuple_impl<0UL,_HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>_*,_HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::OpNewDeleter>
         .
         super__Head_base<0UL,_HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>_*,_false>
         ._M_head_impl;
    (this->metadata)._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl[local_28] = '\0';
    uVar6 = this->tableSizeMask;
    uVar5 = this->numElements - 1;
    this->numElements = uVar5;
    if (uVar6 + 1 == 0x80 || uVar6 + 1 >> 2 <= uVar5) {
      while( true ) {
        uVar5 = local_28 + 1 & uVar6;
        bVar1 = (this->metadata)._M_t.
                super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl[uVar5];
        if ((-1 < (char)bVar1) || (((int)uVar5 - (uint)bVar1 & 0x7f) == 0)) break;
        _Var2._M_head_impl[local_28].key_ = _Var2._M_head_impl[uVar5].key_;
        *(int *)((long)(_Var2._M_head_impl + local_28) + 8) =
             *(int *)((long)(_Var2._M_head_impl + uVar5) + 8);
        puVar3 = (this->metadata)._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        puVar3[local_28] = puVar3[uVar5];
        (this->metadata)._M_t.
        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl[uVar5] = '\0';
        uVar6 = this->tableSizeMask;
        local_28 = uVar5;
      }
    }
    else {
      shrinkTable(this);
    }
  }
  return bVar4;
}

Assistant:

bool erase(const KeyType& key) {
    u64 pos, startPos, maxPos;
    u8 meta;
    if (!findPosition(key, meta, startPos, maxPos, pos)) return false;
    // delete element at position pos
    Entry* entryArray = entries.get();
    entryArray[pos].~Entry();
    metadata[pos] = 0;

    // retain at least a quarter of slots occupied, otherwise shrink the table
    // if its not at its minimum size already
    --numElements;
    u64 capacity = tableSizeMask + 1;
    if (capacity != 128 && numElements < capacity / 4) {
      shrinkTable();
      return true;
    }

    // shift elements after pos backwards
    while (true) {
      u64 shift = (pos + 1) & tableSizeMask;
      if (!occupied(metadata[shift])) return true;

      u64 dist = distanceFromIdealSlot(shift);
      if (dist == 0) return true;

      entryArray[pos] = std::move(entryArray[shift]);
      metadata[pos] = metadata[shift];
      metadata[shift] = 0;
      pos = shift;
    }
  }